

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O2

void __thiscall cppnet::Address::Address(Address *this,Address *addr)

{
  this->_address_type = addr->_address_type;
  std::__cxx11::string::string((string *)&this->_ip,(string *)&addr->_ip);
  this->_port = addr->_port;
  return;
}

Assistant:

Address::Address(const Address& addr):
    _address_type(addr._address_type),
    _ip(addr._ip),
    _port(addr._port) {

}